

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelBuilder.cpp
# Opt level: O0

uint __thiscall FMB::FiniteModelBuilder::estimateInstanceCount(FiniteModelBuilder *this)

{
  DArray<unsigned_int> *this_00;
  bool bVar1;
  uint uVar2;
  DArray<unsigned_int> **ppDVar3;
  uint *puVar4;
  long in_RDI;
  uint srt;
  uint var;
  DArray<unsigned_int> *varSorts;
  uint vars;
  Clause *c;
  uint instances;
  Iterator cit;
  uint res;
  Clause *in_stack_ffffffffffffffa8;
  DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  int local_1c;
  Iterator local_18;
  uint local_c;
  
  local_c = 0;
  Lib::List<Kernel::Clause_*>::Iterator::Iterator
            (&local_18,*(List<Kernel::Clause_*> **)(in_RDI + 0x108));
  while (bVar1 = Lib::List<Kernel::Clause_*>::Iterator::hasNext((Iterator *)0x2be4a6), bVar1) {
    local_1c = 1;
    Lib::List<Kernel::Clause_*>::Iterator::next((Iterator *)in_stack_ffffffffffffffb0);
    uVar2 = Kernel::Clause::varCnt
                      ((Clause *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ppDVar3 = Lib::
              DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::get(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    this_00 = *ppDVar3;
    if (this_00 != (DArray<unsigned_int> *)0x0) {
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < uVar2;
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        puVar4 = Lib::DArray<unsigned_int>::operator[](this_00,(ulong)in_stack_ffffffffffffffc4);
        in_stack_ffffffffffffffc0 = *puVar4;
        in_stack_ffffffffffffffa8 = (Clause *)(in_RDI + 0x1d0);
        puVar4 = Lib::DArray<unsigned_int>::operator[]
                           ((DArray<unsigned_int> *)(*(long *)(in_RDI + 0xf8) + 0xa0),
                            (ulong)in_stack_ffffffffffffffc0);
        in_stack_ffffffffffffffb0 =
             (DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)Lib::DArray<unsigned_int>::operator[]
                          ((DArray<unsigned_int> *)in_stack_ffffffffffffffa8,(ulong)*puVar4);
        puVar4 = Lib::DArray<unsigned_int>::operator[]
                           ((DArray<unsigned_int> *)(*(long *)(in_RDI + 0xf8) + 0x68),
                            (ulong)in_stack_ffffffffffffffc0);
        puVar4 = std::min<unsigned_int>(&in_stack_ffffffffffffffb0->_timestamp,puVar4);
        local_1c = *puVar4 * local_1c;
      }
      local_c = local_1c + local_c;
    }
  }
  return local_c;
}

Assistant:

unsigned FiniteModelBuilder::estimateInstanceCount()
{
  unsigned res = 0;
  ClauseList::Iterator cit(_clauses);

  while(cit.hasNext()){
    unsigned instances = 1;

    Clause* c = cit.next();
    unsigned vars = c->varCnt();
    const DArray<unsigned>* varSorts = _clauseVariableSorts.get(c) ;
    if(!varSorts){
      continue;
    }

    for(unsigned var=0;var<vars;var++){
      unsigned srt = (*varSorts)[var];
      instances *= min(_distinctSortSizes[_sortedSignature->parents[srt]],_sortedSignature->sortBounds[srt]);
    }

    res += instances;
  }
  return res;
}